

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

bool __thiscall
ImPlot::StairsRenderer<ImPlot::GetterXsYs<double>,_ImPlot::TransformerLinLog>::operator()
          (StairsRenderer<ImPlot::GetterXsYs<double>,_ImPlot::TransformerLinLog> *this,
          ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  float *pfVar1;
  float fVar2;
  double dVar3;
  double dVar4;
  ImVec2 IVar5;
  int iVar6;
  ImU32 IVar7;
  uint uVar8;
  GetterXsYs<double> *pGVar9;
  TransformerLinLog *pTVar10;
  ImPlotPlot *pIVar11;
  ImDrawVert *pIVar12;
  ImDrawIdx *pIVar13;
  ImPlotContext *pIVar14;
  bool bVar15;
  long lVar16;
  ImDrawIdx IVar17;
  double dVar18;
  ImVec2 IVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  
  pIVar14 = GImPlot;
  pGVar9 = this->Getter;
  pTVar10 = this->Transformer;
  iVar6 = pGVar9->Count;
  lVar16 = (long)(((pGVar9->Offset + prim + 1) % iVar6 + iVar6) % iVar6) * (long)pGVar9->Stride;
  dVar3 = *(double *)((long)pGVar9->Xs + lVar16);
  dVar18 = log10(*(double *)((long)pGVar9->Ys + lVar16) /
                 GImPlot->CurrentPlot->YAxis[pTVar10->YAxis].Range.Min);
  iVar6 = pTVar10->YAxis;
  pIVar11 = pIVar14->CurrentPlot;
  dVar4 = pIVar11->YAxis[iVar6].Range.Min;
  IVar19.x = (float)((dVar3 - (pIVar11->XAxis).Range.Min) * pIVar14->Mx +
                    (double)pIVar14->PixelRange[iVar6].Min.x);
  fVar20 = (float)((((double)(float)(dVar18 / pIVar14->LogDenY[iVar6]) *
                     (pIVar11->YAxis[iVar6].Range.Max - dVar4) + dVar4) - dVar4) *
                   pIVar14->My[iVar6] + (double)pIVar14->PixelRange[iVar6].Min.y);
  fVar2 = (this->P1).x;
  fVar21 = (this->P1).y;
  fVar22 = fVar21;
  if (fVar20 <= fVar21) {
    fVar22 = fVar20;
  }
  bVar15 = false;
  if ((fVar22 < (cull_rect->Max).y) &&
     (fVar21 = (float)(-(uint)(fVar20 <= fVar21) & (uint)fVar21 |
                      ~-(uint)(fVar20 <= fVar21) & (uint)fVar20), pfVar1 = &(cull_rect->Min).y,
     bVar15 = false, *pfVar1 <= fVar21 && fVar21 != *pfVar1)) {
    fVar21 = fVar2;
    if (IVar19.x <= fVar2) {
      fVar21 = IVar19.x;
    }
    if (fVar21 < (cull_rect->Max).x) {
      fVar21 = (float)(~-(uint)(IVar19.x <= fVar2) & (uint)IVar19.x |
                      -(uint)(IVar19.x <= fVar2) & (uint)fVar2);
      bVar15 = (cull_rect->Min).x <= fVar21 && fVar21 != (cull_rect->Min).x;
    }
  }
  if (bVar15 != false) {
    fVar21 = (this->P1).y;
    fVar22 = fVar21 + this->HalfWeight;
    fVar21 = fVar21 - this->HalfWeight;
    IVar7 = this->Col;
    IVar5 = *uv;
    pIVar12 = DrawList->_VtxWritePtr;
    (pIVar12->pos).x = fVar2;
    (pIVar12->pos).y = fVar22;
    DrawList->_VtxWritePtr->uv = IVar5;
    pIVar12 = DrawList->_VtxWritePtr;
    pIVar12->col = IVar7;
    pIVar12[1].pos.x = IVar19.x;
    pIVar12[1].pos.y = fVar21;
    DrawList->_VtxWritePtr[1].uv = IVar5;
    pIVar12 = DrawList->_VtxWritePtr;
    pIVar12[1].col = IVar7;
    pIVar12[2].pos.x = fVar2;
    pIVar12[2].pos.y = fVar21;
    pIVar12[2].uv = IVar5;
    pIVar12 = DrawList->_VtxWritePtr;
    pIVar12[2].col = IVar7;
    pIVar12[3].pos.x = IVar19.x;
    pIVar12[3].pos.y = fVar22;
    pIVar12[3].uv = IVar5;
    pIVar12 = DrawList->_VtxWritePtr;
    pIVar12[3].col = IVar7;
    DrawList->_VtxWritePtr = pIVar12 + 4;
    uVar8 = DrawList->_VtxCurrentIdx;
    pIVar13 = DrawList->_IdxWritePtr;
    IVar17 = (ImDrawIdx)uVar8;
    *pIVar13 = IVar17;
    pIVar13[1] = IVar17 + 1;
    pIVar13[2] = IVar17 + 2;
    pIVar13[3] = IVar17;
    pIVar13[4] = IVar17 + 1;
    pIVar13[5] = IVar17 + 3;
    DrawList->_IdxWritePtr = pIVar13 + 6;
    DrawList->_VtxCurrentIdx = uVar8 + 4;
    fVar22 = IVar19.x - this->HalfWeight;
    fVar21 = this->HalfWeight + IVar19.x;
    fVar2 = (this->P1).y;
    IVar7 = this->Col;
    IVar5 = *uv;
    pIVar12[4].pos.x = fVar22;
    pIVar12[4].pos.y = fVar20;
    DrawList->_VtxWritePtr->uv = IVar5;
    pIVar12 = DrawList->_VtxWritePtr;
    pIVar12->col = IVar7;
    pIVar12[1].pos.x = fVar21;
    pIVar12[1].pos.y = fVar2;
    DrawList->_VtxWritePtr[1].uv = IVar5;
    pIVar12 = DrawList->_VtxWritePtr;
    pIVar12[1].col = IVar7;
    pIVar12[2].pos.x = fVar22;
    pIVar12[2].pos.y = fVar2;
    pIVar12[2].uv = IVar5;
    pIVar12 = DrawList->_VtxWritePtr;
    pIVar12[2].col = IVar7;
    pIVar12[3].pos.x = fVar21;
    pIVar12[3].pos.y = fVar20;
    pIVar12[3].uv = IVar5;
    pIVar12 = DrawList->_VtxWritePtr;
    pIVar12[3].col = IVar7;
    DrawList->_VtxWritePtr = pIVar12 + 4;
    uVar8 = DrawList->_VtxCurrentIdx;
    pIVar13 = DrawList->_IdxWritePtr;
    IVar17 = (ImDrawIdx)uVar8;
    *pIVar13 = IVar17;
    pIVar13[1] = IVar17 + 1;
    pIVar13[2] = IVar17 + 2;
    pIVar13[3] = IVar17;
    pIVar13[4] = IVar17 + 1;
    pIVar13[5] = IVar17 + 3;
    DrawList->_IdxWritePtr = pIVar13 + 6;
    DrawList->_VtxCurrentIdx = uVar8 + 4;
  }
  IVar19.y = fVar20;
  this->P1 = IVar19;
  return bVar15;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P2 = Transformer(Getter(prim + 1));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2)))) {
            P1 = P2;
            return false;
        }
        AddRectFilled(ImVec2(P1.x, P1.y + HalfWeight), ImVec2(P2.x, P1.y - HalfWeight), Col, DrawList, uv);
        AddRectFilled(ImVec2(P2.x - HalfWeight, P2.y), ImVec2(P2.x + HalfWeight, P1.y), Col, DrawList, uv);

        // AddLine(P1, P12, Weight, Col, DrawList, uv);
        // AddLine(P12, P2, Weight, Col, DrawList, uv);
        P1 = P2;
        return true;
    }